

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NetworkBroker_impl.hpp
# Opt level: O1

string * __thiscall
helics::NetworkBroker<helics::inproc::InprocComms,(gmlc::networking::InterfaceTypes)4,18>::
generateLocalAddressString_abi_cxx11_
          (string *__return_storage_ptr__,
          NetworkBroker<helics::inproc::InprocComms,(gmlc::networking::InterfaceTypes)4,18> *this)

{
  bool bVar1;
  int iVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__str;
  string local_40;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  bVar1 = CommsInterface::isConnected(*(CommsInterface **)(this + 0xe78));
  if (bVar1) {
    inproc::InprocComms::getAddress_abi_cxx11_(&local_40,*(InprocComms **)(this + 0xe78));
    generateLocalAddressString_abi_cxx11_();
  }
  else {
    iVar2 = pthread_mutex_lock((pthread_mutex_t *)(this + 0xe88));
    if (iVar2 != 0) {
      std::__throw_system_error(iVar2);
    }
    __str = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(this + 0xef0);
    if (*(long *)(this + 0xef8) == 0) {
      __str = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(this + 0x70);
    }
    CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_assign
              (__return_storage_ptr__,__str);
    pthread_mutex_unlock((pthread_mutex_t *)(this + 0xe88));
  }
  return __return_storage_ptr__;
}

Assistant:

std::string NetworkBroker<COMMS, baseline, tcode>::generateLocalAddressString() const
{
    using InterfaceTypes = gmlc::networking::InterfaceTypes;
    std::string add;
    if (CommsBroker<COMMS, CoreBroker>::comms->isConnected()) {
        add = CommsBroker<COMMS, CoreBroker>::comms->getAddress();
    } else {
        std::lock_guard<std::mutex> lock(dataMutex);
        switch (baseline) {
            case InterfaceTypes::TCP:
            case InterfaceTypes::IP:
            case InterfaceTypes::UDP:
                if (!netInfo.localInterface.empty() && (netInfo.localInterface.back() == '*')) {
                    add = gmlc::networking::makePortAddress(
                        netInfo.localInterface.substr(0, netInfo.localInterface.size() - 1),
                        netInfo.portNumber);
                } else {
                    add = gmlc::networking::makePortAddress(netInfo.localInterface,
                                                            netInfo.portNumber);
                }
                break;
            case InterfaceTypes::INPROC:
            case InterfaceTypes::IPC:
            default:
                if (!netInfo.localInterface.empty()) {
                    add = netInfo.localInterface;
                } else {
                    add = CoreBroker::getIdentifier();
                }
                break;
        }
    }
    return add;
}